

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_read_native_straddle(mpack_reader_t *reader,char *p,size_t count)

{
  char *__src;
  mpack_reader_error_t p_Var1;
  size_t sVar2;
  mpack_error_t mVar3;
  size_t __n;
  
  if (reader->error == mpack_ok) {
    __src = reader->data;
    if (reader->fill == (mpack_reader_fill_t)0x0) {
      reader->error = mpack_error_invalid;
      reader->end = __src;
      p_Var1 = reader->error_fn;
      if (p_Var1 == (mpack_reader_error_t)0x0) goto LAB_00104772;
      mVar3 = mpack_error_invalid;
    }
    else {
      sVar2 = reader->size;
      if (sVar2 != 0) {
        if (reader->end != __src) {
          __n = (long)reader->end - (long)__src;
          memcpy(p,__src,__n);
          count = count - __n;
          p = p + __n;
          reader->data = reader->data + __n;
          sVar2 = reader->size;
        }
        if (sVar2 >> 5 < count) {
          mpack_fill_range(reader,p,count,count);
          return;
        }
        sVar2 = mpack_fill_range(reader,reader->buffer,count,sVar2);
        if (reader->error == mpack_ok) {
          memcpy(p,reader->buffer,count);
          reader->data = reader->buffer + count;
          reader->end = reader->buffer + sVar2;
        }
        return;
      }
      reader->error = mpack_error_io;
      reader->end = __src;
      p_Var1 = reader->error_fn;
      if (p_Var1 == (mpack_reader_error_t)0x0) goto LAB_00104772;
      mVar3 = mpack_error_io;
    }
    (*p_Var1)(reader,mVar3);
  }
LAB_00104772:
  memset(p,0,count);
  return;
}

Assistant:

MPACK_NOINLINE void mpack_read_native_straddle(mpack_reader_t* reader, char* p, size_t count) {
    mpack_assert(count == 0 || p != NULL, "data pointer for %i bytes is NULL", (int)count);

    if (mpack_reader_error(reader) != mpack_ok) {
        mpack_memset(p, 0, count);
        return;
    }

    size_t left = (size_t)(reader->end - reader->data);
    mpack_log("big read for %i bytes into %p, %i left in buffer, buffer size %i\n",
            (int)count, p, (int)left, (int)reader->size);

    if (count <= left) {
        mpack_assert(0,
                "big read requested for %i bytes, but there are %i bytes "
                "left in buffer. call mpack_read_native() instead",
                (int)count, (int)left);
        mpack_reader_flag_error(reader, mpack_error_bug);
        mpack_memset(p, 0, count);
        return;
    }

    // we'll need a fill function to get more data. if there's no
    // fill function, the buffer should contain an entire MessagePack
    // object, so we raise mpack_error_invalid instead of mpack_error_io
    // on truncated data.
    if (reader->fill == NULL) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        mpack_memset(p, 0, count);
        return;
    }

    if (reader->size == 0) {
        // somewhat debatable what error should be returned here. when
        // initializing a reader with an in-memory buffer it's not
        // necessarily a bug if the data is blank; it might just have
        // been truncated to zero. for this reason we return the same
        // error as if the data was truncated.
        mpack_reader_flag_error(reader, mpack_error_io);
        mpack_memset(p, 0, count);
        return;
    }

    // flush what's left of the buffer
    if (left > 0) {
        mpack_log("flushing %i bytes remaining in buffer\n", (int)left);
        mpack_memcpy(p, reader->data, left);
        count -= left;
        p += left;
        reader->data += left;
    }

    // if the remaining data needed is some small fraction of the
    // buffer size, we'll try to fill the buffer as much as possible
    // and copy the needed data out.
    if (count <= reader->size / MPACK_READER_SMALL_FRACTION_DENOMINATOR) {
        size_t read = mpack_fill_range(reader, reader->buffer, count, reader->size);
        if (mpack_reader_error(reader) != mpack_ok)
            return;
        mpack_memcpy(p, reader->buffer, count);
        reader->data = reader->buffer + count;
        reader->end = reader->buffer + read;

    // otherwise we read the remaining data directly into the target.
    } else {
        mpack_log("reading %i additional bytes\n", (int)count);
        mpack_fill_range(reader, p, count, count);
    }
}